

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::FormattingScene::ObjectBegin(FormattingScene *this,string *name,FileLoc loc)

{
  bool bVar1;
  mapped_type *pmVar2;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff38;
  int *args_1;
  int extra;
  FormattingScene *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  FileLoc *in_stack_ffffffffffffff80;
  string local_78 [52];
  int local_44;
  string local_40 [32];
  _Self local_20;
  _Self local_18;
  string *local_10;
  
  args_1 = (int *)&stack0x00000008;
  if (((in_RDI->field_2)._M_local_buf[1] & 1U) == 0) {
    indent_abi_cxx11_(in_stack_ffffffffffffff68,(int)((ulong)in_RDI >> 0x20));
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
              );
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  else {
    local_10 = in_RSI;
    local_18._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(in_stack_ffffffffffffff38,(key_type *)0x44ea64);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_ffffffffffffff38);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (bVar1) {
      Warning<std::__cxx11::string_const&>
                (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
      local_44 = ObjectBegin::count;
      ObjectBegin::count = ObjectBegin::count + 1;
      StringPrintf<std::__cxx11::string_const&,int>((char *)in_stack_ffffffffffffff68,in_RDI,args_1)
      ;
      extra = (int)((ulong)in_RDI >> 0x20);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::__cxx11::string::operator=((string *)pmVar2,local_40);
      std::__cxx11::string::~string(local_40);
    }
    else {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      extra = (int)((ulong)in_RDI >> 0x20);
      std::__cxx11::string::operator=((string *)pmVar2,local_10);
    }
    indent_abi_cxx11_(in_stack_ffffffffffffff68,extra);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Printf<std::__cxx11::string,std::__cxx11::string&>
              ((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
              );
    std::__cxx11::string::~string(local_78);
  }
  return;
}

Assistant:

void FormattingScene::ObjectBegin(const std::string &name, FileLoc loc) {
    if (upgrade) {
        if (definedObjectInstances.find(name) != definedObjectInstances.end()) {
            static int count = 0;
            Warning(&loc, "%s: renaming multiply-defined object instance", name);
            definedObjectInstances[name] = StringPrintf("%s-renamed-%d", name, count++);
        } else
            definedObjectInstances[name] = name;
        Printf("%sObjectBegin \"%s\"\n", indent(), definedObjectInstances[name]);
    } else
        Printf("%sObjectBegin \"%s\"\n", indent(), name);
}